

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

void Str_NtkBalanceMulti(Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize
                        )

{
  ulong uVar1;
  Str_Ntk_t *p_00;
  Vec_Int_t *p_01;
  Str_Obj_t *pSuper;
  uint *pCost;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  Str_Ntk_t *pSVar5;
  Str_Ntk_t *extraout_RDX;
  Str_Ntk_t *extraout_RDX_00;
  uint uVar6;
  uint uVar7;
  long lVar8;
  Str_Ntk_t *p_02;
  Str_Ntk_t *pSVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  undefined8 uVar19;
  word pMatrix [256];
  
  p_00 = (Str_Ntk_t *)pNew->vSuper;
  if (p_00->nObjs < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vSuper)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,0x44a,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  p_01 = pNew->vStore;
  if (p_01->nCap < 0x100) {
    __assert_fail("Limit <= Vec_IntCap(vCosts)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,1099,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  pSuper = p_00->pObjs;
  pCost = (uint *)p_01->pArray;
  p_00->nObjsAlloc = 0;
  if (0xf < *(uint *)pObj) {
    uVar6 = 0;
    do {
      uVar2 = pObj->iOffset + uVar6;
      if (((int)uVar2 < 0) || ((p->vFanins).nSize <= (int)uVar2)) goto LAB_0078181d;
      uVar2 = (p->vFanins).pArray[uVar2];
      if ((int)uVar2 < 0) goto LAB_0078183c;
      if (p->nObjs <= (int)(uVar2 >> 1)) {
        __assert_fail("i < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                      ,0x52,"Str_Obj_t *Str_NtkObj(Str_Ntk_t *, int)");
      }
      uVar13 = p->pObjs[uVar2 >> 1].iCopy;
      if ((int)uVar13 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Vec_IntPush((Vec_Int_t *)p_00,uVar13 ^ uVar2 & 1);
      uVar6 = uVar6 + 1;
    } while (uVar6 < *(uint *)pObj >> 4);
  }
  p_02 = (Str_Ntk_t *)(long)p_00->nObjsAlloc;
  qsort(p_00->pObjs,(size_t)p_02,4,Vec_IntSortCompare1);
  if (((undefined1  [16])*pObj & (undefined1  [16])0xf) == (undefined1  [16])0x3) {
    uVar19 = 0x78115f;
    Gia_ManSimplifyAnd((Vec_Int_t *)p_00);
  }
  else {
    uVar19 = 0x781166;
    Gia_ManSimplifyXor((Vec_Int_t *)p_00);
  }
  iVar15 = (int)uVar19;
  iVar3 = p_00->nObjsAlloc;
  if (iVar3 < 1) {
    __assert_fail("Vec_IntSize(vSuper) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                  ,0x456,
                  "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  if (iVar3 != 2) {
    if (iVar3 == 1) {
      iVar3 = *(int *)p_00->pObjs;
      goto LAB_00781807;
    }
    p_01->nSize = 0;
    uVar6 = p_00->nObjsAlloc;
    if (0 < (int)uVar6) {
      lVar8 = 0;
      do {
        uVar6 = *(uint *)((long)&p_00->pObjs->field_0x0 + lVar8 * 4);
        if ((int)uVar6 < 0) {
LAB_0078183c:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar6 = uVar6 >> 1;
        if (vDelay->nSize <= (int)uVar6) {
LAB_0078181d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        p_02 = (Str_Ntk_t *)(ulong)(uint)vDelay->pArray[uVar6];
        uVar19 = 0x7811d3;
        Vec_IntPush(p_01,vDelay->pArray[uVar6]);
        lVar8 = lVar8 + 1;
        uVar6 = p_00->nObjsAlloc;
      } while (lVar8 < (int)uVar6);
    }
    pSVar5 = p_00;
    if (1 < (int)uVar6) {
      pSVar5 = (Str_Ntk_t *)0x1;
      p_02 = (Str_Ntk_t *)0x0;
      do {
        uVar4 = (ulong)p_02 & 0xffffffff;
        pSVar9 = pSVar5;
        do {
          uVar2 = (uint)pSVar9;
          if ((int)pCost[(int)(uint)uVar4] <= (int)pCost[(long)pSVar9]) {
            uVar2 = (uint)uVar4;
          }
          pSVar9 = (Str_Ntk_t *)((long)&pSVar9->nObjs + 1);
          uVar4 = (ulong)uVar2;
        } while ((Str_Ntk_t *)(ulong)uVar6 != pSVar9);
        iVar3 = *(int *)((long)&pSuper->field_0x0 + p_02 * 4);
        *(int *)((long)&pSuper->field_0x0 + p_02 * 4) =
             *(int *)((long)&pSuper->field_0x0 + (long)(int)uVar2 * 4);
        *(int *)((long)&pSuper->field_0x0 + (long)(int)uVar2 * 4) = iVar3;
        uVar13 = pCost[(long)p_02];
        pCost[(long)p_02] = pCost[(int)uVar2];
        p_02 = (Str_Ntk_t *)((long)&p_02->nObjs + 1);
        pCost[(int)uVar2] = uVar13;
        pSVar5 = (Str_Ntk_t *)((long)&pSVar5->nObjs + 1);
      } while (p_02 != (Str_Ntk_t *)(ulong)(uVar6 - 1));
    }
    if (p_00->nObjsAlloc < 0x40) {
      uVar19 = 0x781273;
      p_02 = p_00;
      Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,(Vec_Int_t *)pSVar5,pMatrix,0x100);
      pSVar5 = extraout_RDX;
    }
    iVar15 = (int)uVar19;
    uVar6 = p_00->nObjsAlloc;
    while (2 < (int)uVar6) {
      if ((int)uVar6 < 0x41) {
        if (uVar6 == 0x40) {
          uVar19 = 0x7812d4;
          p_02 = p_00;
          Str_ManVectorAffinity(pNew,(Vec_Int_t *)p_00,(Vec_Int_t *)pSVar5,pMatrix,0x100);
        }
        uVar6 = p_00->nObjsAlloc;
        if (0x40 < (int)uVar6) {
          __assert_fail("Vec_IntSize(vSuper) <= 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                        ,0x47f,
                        "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                       );
        }
        uVar2 = *pCost;
        if ((uVar2 == 0x11) && (pCost[1] == 0x11)) {
          uVar13 = 1;
LAB_007817a3:
          uVar2 = 0;
        }
        else {
          pSVar5 = (Str_Ntk_t *)0x0;
          if (0 < (int)uVar6) {
            do {
              if (0xf < (pCost[(long)pSVar5] ^ uVar2)) goto LAB_00781329;
              pSVar5 = (Str_Ntk_t *)((long)&pSVar5->nObjs + 1);
            } while ((Str_Ntk_t *)(ulong)uVar6 != pSVar5);
            pSVar5 = (Str_Ntk_t *)(ulong)uVar6;
          }
LAB_00781329:
          iVar3 = (int)pSVar5;
          if (iVar3 == 0) {
            uVar13 = 0xffffffff;
            iVar15 = -1;
          }
          else {
            if (iVar3 == 1) {
              uVar4 = pMatrix[1] & pMatrix[0];
              if (uVar4 == 0) {
                uVar4 = 0;
              }
              else {
                p_02 = (Str_Ntk_t *)(uVar4 - 1 & uVar4);
                if (p_02 == (Str_Ntk_t *)0x0) {
                  uVar4 = 1;
                }
                else {
                  uVar4 = (ulong)&p_02[-1].field_0x4f & (ulong)p_02;
                  if (uVar4 == 0) {
                    uVar4 = 2;
                  }
                  else {
                    uVar4 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
                    p_02 = (Str_Ntk_t *)0x3333333333333333;
                    uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
                    uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38;
                  }
                }
              }
              uVar14 = 1;
              uVar13 = 1;
              if (2 < (int)uVar6) {
                p_02 = (Str_Ntk_t *)0x2;
                do {
                  uVar13 = (uint)uVar14;
                  if (0xf < (pCost[(long)p_02] ^ pCost[1])) break;
                  uVar11 = pMatrix[(long)p_02] & pMatrix[0];
                  if (uVar11 == 0) {
                    uVar2 = 0;
                  }
                  else {
                    uVar11 = uVar11 - 1 & uVar11;
                    if (uVar11 == 0) {
                      uVar2 = 1;
                    }
                    else {
                      uVar11 = uVar11 - 1 & uVar11;
                      if (uVar11 == 0) {
                        uVar2 = 2;
                      }
                      else {
                        uVar11 = uVar11 - (uVar11 >> 1 & 0x5555555555555555);
                        uVar11 = (uVar11 >> 2 & 0x3333333333333333) + (uVar11 & 0x3333333333333333);
                        uVar2 = (uint)(byte)(((uVar11 >> 4) + uVar11 & 0xf0f0f0f0f0f0f0f) *
                                             0x101010101010101 >> 0x38);
                      }
                    }
                  }
                  if ((uint)uVar4 < uVar2) {
                    uVar14 = (ulong)p_02 & 0xffffffff;
                  }
                  uVar13 = (uint)uVar14;
                  if ((uint)uVar4 <= uVar2) {
                    uVar4 = (ulong)uVar2;
                  }
                  p_02 = (Str_Ntk_t *)((long)&p_02->nObjs + 1);
                } while ((Str_Ntk_t *)(ulong)uVar6 != p_02);
              }
              if (((int)uVar13 < 1) || ((int)uVar6 <= (int)uVar13)) {
                __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                              ,0x49b,
                              "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                             );
              }
              goto LAB_007817a3;
            }
            p_02 = (Str_Ntk_t *)((ulong)pSVar5 & 0xffffffff);
            uVar16 = 0xffffffff;
            pSVar9 = (Str_Ntk_t *)0x1;
            iVar15 = -1;
            uVar4 = 0xffffffff;
            do {
              iVar18 = (pCost[(long)pSVar9] & 0xf) + (uVar2 & 0xf);
              if (iVar18 <= nLutSize) {
                uVar14 = pMatrix[(long)pSVar9] & pMatrix[0];
                if (uVar14 == 0) {
                  uVar13 = 0;
                }
                else {
                  uVar14 = uVar14 - 1 & uVar14;
                  if (uVar14 == 0) {
                    uVar13 = 1;
                  }
                  else {
                    uVar14 = uVar14 - 1 & uVar14;
                    if (uVar14 == 0) {
                      uVar13 = 2;
                    }
                    else {
                      uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
                      uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
                      uVar13 = (uint)(byte)(((uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f) *
                                            0x101010101010101 >> 0x38);
                    }
                  }
                }
                if ((iVar15 < iVar18) || ((iVar15 == iVar18 && ((int)uVar16 < (int)uVar13)))) {
                  uVar4 = (ulong)pSVar9 & 0xffffffff;
                  iVar15 = iVar18;
                  uVar16 = uVar13;
                }
              }
              uVar13 = (uint)uVar4;
              pSVar9 = (Str_Ntk_t *)((long)&pSVar9->nObjs + 1);
            } while (p_02 != pSVar9);
          }
          if (iVar15 == nLutSize) {
            if (((int)uVar13 < 1) || ((int)uVar6 <= (int)uVar13)) {
              __assert_fail("iBest > 0 && iBest < Vec_IntSize(vSuper)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                            ,0x4af,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            uVar2 = 0;
          }
          else {
            if (iVar3 == 0) {
              uVar2 = 0xffffffff;
              p_02 = (Str_Ntk_t *)0xffffffff;
            }
            else {
              uVar14 = (ulong)pSVar5 & 0xffffffff;
              uVar13 = 0xffffffff;
              uVar11 = 1;
              uVar16 = 0xffffffff;
              iVar3 = -1;
              iVar15 = -1;
              p_02 = (Str_Ntk_t *)0xffffffff;
              uVar2 = 0xffffffff;
              uVar4 = 0;
              do {
                uVar1 = uVar4 + 1;
                if (uVar1 < uVar14) {
                  uVar12 = (int)uVar4 << 0x10;
                  uVar10 = uVar11;
                  do {
                    uVar17 = pMatrix[uVar10] & pMatrix[uVar4];
                    if (uVar17 == 0) {
                      uVar7 = 0;
                    }
                    else {
                      uVar17 = uVar17 - 1 & uVar17;
                      if (uVar17 == 0) {
                        uVar7 = 1;
                      }
                      else {
                        uVar17 = uVar17 - 1 & uVar17;
                        if (uVar17 == 0) {
                          uVar7 = 2;
                        }
                        else {
                          uVar17 = uVar17 - (uVar17 >> 1 & 0x5555555555555555);
                          uVar17 = (uVar17 >> 2 & 0x3333333333333333) +
                                   (uVar17 & 0x3333333333333333);
                          uVar7 = (uint)(byte)(((uVar17 >> 4) + uVar17 & 0xf0f0f0f0f0f0f0f) *
                                               0x101010101010101 >> 0x38);
                        }
                      }
                    }
                    iVar18 = (pCost[uVar10] & 0xf) + (pCost[uVar4] & 0xf);
                    if (nLutSize < iVar18) {
                      if (((int)uVar13 < (int)uVar7) || ((uVar13 == uVar7 && (iVar3 < iVar18)))) {
                        p_02 = (Str_Ntk_t *)(ulong)(uVar12 | (uint)uVar10);
                        uVar13 = uVar7;
                        iVar3 = iVar18;
                      }
                    }
                    else if (((int)uVar16 < (int)uVar7) || ((uVar16 == uVar7 && (iVar15 < iVar18))))
                    {
                      uVar2 = uVar12 | (uint)uVar10;
                      uVar16 = uVar7;
                      iVar15 = iVar18;
                    }
                    uVar10 = uVar10 + 1;
                  } while (uVar14 != uVar10);
                }
                uVar11 = uVar11 + 1;
                uVar4 = uVar1;
              } while (uVar1 != uVar14);
            }
            if ((int)uVar2 < 0) {
              uVar2 = (uint)p_02;
              if ((int)uVar2 < 1) {
                __assert_fail("iBest2 > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                              ,0x4d0,
                              "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                             );
              }
            }
            else if (uVar2 == 0) {
              __assert_fail("iBest > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaStr.c"
                            ,0x4c9,
                            "void Str_NtkBalanceMulti(Gia_Man_t *, Str_Ntk_t *, Str_Obj_t *, Vec_Int_t *, int)"
                           );
            }
            uVar13 = uVar2 & 0xffff;
            uVar2 = uVar2 >> 0x10;
          }
        }
      }
      else {
        uVar2 = 0;
        uVar13 = 1;
      }
      Str_NtkBalanceTwo(pNew,p_02,pObj,uVar2,uVar13,vDelay,(int *)pCost,(int *)pSuper,pMatrix,uVar6,
                        nLutSize,(int)uVar19);
      iVar15 = (int)uVar19;
      p_00->nObjsAlloc = p_00->nObjsAlloc + -1;
      p_01->nSize = p_01->nSize + -1;
      pSVar5 = extraout_RDX_00;
      uVar6 = p_00->nObjsAlloc;
    }
  }
  iVar3 = Str_NtkBalanceTwo(pNew,p_02,pObj,0,1,vDelay,(int *)pCost,(int *)pSuper,pMatrix,2,nLutSize,
                            iVar15);
LAB_00781807:
  pObj->iCopy = iVar3;
  return;
}

Assistant:

void Str_NtkBalanceMulti( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    word pMatrix[256];
    int Limit = 256;
    Vec_Int_t * vSuper = pNew->vSuper;
    Vec_Int_t * vCosts = pNew->vStore;
    int * pSuper = Vec_IntArray(vSuper);
    int * pCost  = Vec_IntArray(vCosts);
    int k, iLit, MatrixSize = 0;
    assert( Limit <= Vec_IntCap(vSuper) );
    assert( Limit <= Vec_IntCap(vCosts) );

    // collect nodes
    Vec_IntClear( vSuper );
    for ( k = 0; k < (int)pObj->nFanins; k++ )
        Vec_IntPush( vSuper, Str_ObjFaninCopy(p, pObj, k) );
    Vec_IntSort( vSuper, 0 );
    if ( pObj->Type == STR_AND )
        Gia_ManSimplifyAnd( vSuper );
    else
        Gia_ManSimplifyXor( vSuper );
    assert( Vec_IntSize(vSuper) > 0 );
    if ( Vec_IntSize(vSuper) == 1 )
    {
        pObj->iCopy = Vec_IntEntry(vSuper, 0);
        return;
    }
    if ( Vec_IntSize(vSuper) == 2 )
    {
        pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );
        return;
    }

    // sort by cost
    Vec_IntClear( vCosts );
    Vec_IntForEachEntry( vSuper, iLit, k )
        Vec_IntPush( vCosts, Vec_IntEntry(vDelay, Abc_Lit2Var(iLit)) );
    Vec_IntSelectSortCost2( pSuper, Vec_IntSize(vSuper), pCost );

    // compute affinity
    if ( Vec_IntSize(vSuper) < 64 )
        MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );

    // start the new product
    while ( Vec_IntSize(vSuper) > 2 )
    {
        // pair the first entry with another one on the same level
        int i, iStop, iBest,iBest2;
        int CostNew, CostBest, CostBest2;
        int OccurNew, OccurBest, OccurBest2;

        if ( Vec_IntSize(vSuper) > 64 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // compute affinity
        if ( Vec_IntSize(vSuper) == 64 )
            MatrixSize = Str_ManVectorAffinity( pNew, vSuper, vCosts, pMatrix, Limit );
        assert( Vec_IntSize(vSuper) <= 64 );
//        Str_PrintState( pCost, pSuper, pMatrix, Vec_IntSize(vSuper) );

        // if the first two are PIs group them
        if ( pCost[0] == 17 && pCost[1] == 17 )
        {
            Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, 2 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }

        // find the end of the level
        for ( iStop = 0; iStop < Vec_IntSize(vSuper); iStop++ )
            if ( (pCost[iStop] >> 4) != (pCost[0] >> 4) )
                break;
        // if there is only one this level, pair it with the best match in the next level
        if ( iStop == 1 )
        {
            iBest = iStop, OccurBest = Str_CountBits(pMatrix[0] & pMatrix[iStop]);
            for ( i = iStop + 1; i < Vec_IntSize(vSuper); i++ )
            {
                if ( (pCost[i] >> 4) != (pCost[iStop] >> 4) )
                    break;
                OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
                if ( OccurBest < OccurNew )
                    iBest = i, OccurBest = OccurNew;
            }
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // pair the first entry with another one on the same level
        iBest = -1; CostBest = -1; OccurBest2 = -1; OccurBest = -1;
        for ( i = 1; i < iStop; i++ )
        {
            CostNew = (pCost[0] & 15) + (pCost[i] & 15);
            if ( CostNew > nLutSize )
                continue;
            OccurNew = Str_CountBits(pMatrix[0] & pMatrix[i]);
            if ( CostBest < CostNew || (CostBest == CostNew && OccurBest < OccurNew) )
                CostBest = CostNew, iBest = i, OccurBest = OccurNew;
        }
        // if the best found is perfect, take it
        if ( CostBest == nLutSize )
        {
            assert( iBest > 0 && iBest < Vec_IntSize(vSuper) );
            Str_NtkBalanceTwo( pNew, p, pObj, 0, iBest, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // find the best pair on this level
        iBest = iBest2 = -1; CostBest = CostBest2 = -1, OccurBest = OccurBest2 = -1;
        for ( i = 0; i < iStop; i++ )
        for ( k = i+1; k < iStop; k++ )
        {
            CostNew  = (pCost[i] & 15) + (pCost[k] & 15);
            OccurNew = Str_CountBits(pMatrix[i] & pMatrix[k]);
            if ( CostNew <= nLutSize ) // the same level
            {
                if ( OccurBest < OccurNew || (OccurBest == OccurNew && CostBest < CostNew ))
                    CostBest = CostNew, iBest = (i << 16) | k, OccurBest = OccurNew;
            }
            else // overflow to the next level
            {
                if ( OccurBest2 < OccurNew || (OccurBest2 == OccurNew && CostBest2 < CostNew) )
                    CostBest2 = CostNew, iBest2 = (i << 16) | k, OccurBest2 = OccurNew;
            }
        }
        if ( iBest >= 0 )
        {
            assert( iBest > 0 );
            Str_NtkBalanceTwo( pNew, p, pObj, iBest>>16, iBest&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, CostBest );
            vSuper->nSize--;
            vCosts->nSize--;
            continue;
        }
        // take any remaining pair
        assert( iBest2 > 0 );
        Str_NtkBalanceTwo( pNew, p, pObj, iBest2>>16, iBest2&0xFFFF, vDelay, pCost, pSuper, pMatrix, Vec_IntSize(vSuper), nLutSize, -1 );
        vSuper->nSize--;
        vCosts->nSize--;
        continue;
    }
    pObj->iCopy = Str_NtkBalanceTwo( pNew, p, pObj, 0, 1, vDelay, pCost, pSuper, pMatrix, 2, nLutSize, -1 );

/*
    // simple
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < Vec_IntSize(vSuper); k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Vec_IntEntry(vSuper, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
*/
}